

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

SatLookAngles *
getSatellitesAndLookAngles
          (SatLookAngles *__return_storage_ptr__,double lat,double lon,double alt,DB *db)

{
  pointer tle;
  vector<Tle,_std::allocator<Tle>_> tles;
  vector<Tle,_std::allocator<Tle>_> local_120;
  Tle local_108;
  
  SatLookAngles::SatLookAngles(__return_storage_ptr__,lat,lon,alt);
  (**db->_vptr_DB)(&local_120,db);
  if (local_120.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_120.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    tle = local_120.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      Tle::Tle(&local_108,tle);
      SatLookAngles::add(__return_storage_ptr__,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.int_designator_._M_dataplus._M_p != &local_108.int_designator_.field_2) {
        operator_delete(local_108.int_designator_._M_dataplus._M_p,
                        local_108.int_designator_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.line_two_._M_dataplus._M_p != &local_108.line_two_.field_2) {
        operator_delete(local_108.line_two_._M_dataplus._M_p,
                        local_108.line_two_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.line_one_._M_dataplus._M_p != &local_108.line_one_.field_2) {
        operator_delete(local_108.line_one_._M_dataplus._M_p,
                        local_108.line_one_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.name_._M_dataplus._M_p != &local_108.name_.field_2) {
        operator_delete(local_108.name_._M_dataplus._M_p,
                        local_108.name_.field_2._M_allocated_capacity + 1);
      }
      tle = tle + 1;
    } while (tle != local_120.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  SatLookAngles::sort(__return_storage_ptr__);
  std::vector<Tle,_std::allocator<Tle>_>::~vector(&local_120);
  return __return_storage_ptr__;
}

Assistant:

SatLookAngles getSatellitesAndLookAngles(double lat, double lon, double alt,
                                         DB &db) {
  SatLookAngles sats(lat, lon, alt);

  // Get the TLEs.
  std::vector<Tle> tles = db.fetchTLEs();

  // Add the TLEs (this will automatically generate look angles.).
  for (const auto &tle : tles)
    sats.add(tle);

  // Sort by increasing range.
  sats.sort();
  return sats;
}